

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiFeatureInfo.cpp
# Opt level: O0

bool vkt::api::anon_unknown_0::isRequiredImageParameterCombination
               (VkPhysicalDeviceFeatures *deviceFeatures,VkFormat format,
               VkFormatProperties *formatProperties,VkImageType imageType,VkImageTiling imageTiling,
               VkImageUsageFlags usageFlags,VkImageCreateFlags createFlags)

{
  bool bVar1;
  int a;
  deBool dVar2;
  TextureFormat local_3c;
  uint local_34;
  VkImageTiling local_30;
  VkImageUsageFlags usageFlags_local;
  VkImageTiling imageTiling_local;
  VkImageType imageType_local;
  VkFormatProperties *formatProperties_local;
  VkPhysicalDeviceFeatures *pVStack_18;
  VkFormat format_local;
  VkPhysicalDeviceFeatures *deviceFeatures_local;
  
  if (imageTiling == VK_IMAGE_TILING_LINEAR) {
    deviceFeatures_local._7_1_ = false;
  }
  else {
    local_34 = usageFlags;
    local_30 = imageTiling;
    usageFlags_local = imageType;
    _imageTiling_local = formatProperties;
    formatProperties_local._4_4_ = format;
    pVStack_18 = deviceFeatures;
    bVar1 = ::vk::isCompressedFormat(format);
    if ((bVar1) && ((local_34 & 0xfffffff8) != 0)) {
      deviceFeatures_local._7_1_ = false;
    }
    else {
      bVar1 = ::vk::isCompressedFormat(formatProperties_local._4_4_);
      if ((bVar1) && ((usageFlags_local == 0 || (usageFlags_local == 2)))) {
        deviceFeatures_local._7_1_ = false;
      }
      else if ((createFlags & 2) == 0) {
        deviceFeatures_local._7_1_ = true;
      }
      else {
        bVar1 = ::vk::isCompressedFormat(formatProperties_local._4_4_);
        if (bVar1) {
          deviceFeatures_local._7_1_ = false;
        }
        else {
          bVar1 = ::vk::isDepthStencilFormat(formatProperties_local._4_4_);
          if (bVar1) {
            deviceFeatures_local._7_1_ = false;
          }
          else {
            local_3c = ::vk::mapVkFormat(formatProperties_local._4_4_);
            a = tcu::TextureFormat::getPixelSize(&local_3c);
            dVar2 = deIsPowerOfTwo32(a);
            if (dVar2 == 0) {
              deviceFeatures_local._7_1_ = false;
            }
            else if (usageFlags_local == 1) {
              deviceFeatures_local._7_1_ = pVStack_18->sparseResidencyImage2D == 1;
            }
            else if (usageFlags_local == 2) {
              deviceFeatures_local._7_1_ = pVStack_18->sparseResidencyImage3D == 1;
            }
            else {
              deviceFeatures_local._7_1_ = false;
            }
          }
        }
      }
    }
  }
  return deviceFeatures_local._7_1_;
}

Assistant:

bool isRequiredImageParameterCombination (const VkPhysicalDeviceFeatures&	deviceFeatures,
										  const VkFormat					format,
										  const VkFormatProperties&			formatProperties,
										  const VkImageType					imageType,
										  const VkImageTiling				imageTiling,
										  const VkImageUsageFlags			usageFlags,
										  const VkImageCreateFlags			createFlags)
{
	DE_UNREF(deviceFeatures);
	DE_UNREF(formatProperties);
	DE_UNREF(createFlags);

	// Linear images can have arbitrary limitations
	if (imageTiling == VK_IMAGE_TILING_LINEAR)
		return false;

	// Support for other usages for compressed formats is optional
	if (isCompressedFormat(format) &&
		(usageFlags & ~(VK_IMAGE_USAGE_SAMPLED_BIT|VK_IMAGE_USAGE_TRANSFER_SRC_BIT|VK_IMAGE_USAGE_TRANSFER_DST_BIT)) != 0)
		return false;

	// Support for 1D, and sliced 3D compressed formats is optional
	if (isCompressedFormat(format) && (imageType == VK_IMAGE_TYPE_1D || imageType == VK_IMAGE_TYPE_3D))
		return false;

	DE_ASSERT(deviceFeatures.sparseBinding || (createFlags & (VK_IMAGE_CREATE_SPARSE_BINDING_BIT|VK_IMAGE_CREATE_SPARSE_RESIDENCY_BIT)) == 0);
	DE_ASSERT(deviceFeatures.sparseResidencyAliased || (createFlags & VK_IMAGE_CREATE_SPARSE_ALIASED_BIT) == 0);

	if (createFlags & VK_IMAGE_CREATE_SPARSE_RESIDENCY_BIT)
	{
		if (isCompressedFormat(format))
			return false;

		if (isDepthStencilFormat(format))
			return false;

		if (!deIsPowerOfTwo32(mapVkFormat(format).getPixelSize()))
			return false;

		switch (imageType)
		{
			case VK_IMAGE_TYPE_2D:
				return (deviceFeatures.sparseResidencyImage2D == VK_TRUE);
			case VK_IMAGE_TYPE_3D:
				return (deviceFeatures.sparseResidencyImage3D == VK_TRUE);
			default:
				return false;
		}
	}

	return true;
}